

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HistogramBasedDistribution.cpp
# Opt level: O0

double __thiscall
HistogramBasedDistribution::probability(HistogramBasedDistribution *this,int value)

{
  const_iterator __first;
  const_iterator __last;
  pointer ppVar1;
  int in_ESI;
  int *in_RDI;
  pair<int,_double> pVar2;
  iter_t cit;
  vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
  *in_stack_ffffffffffffffa8;
  __normal_iterator<const_std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
  local_20 [3];
  double local_8;
  
  if (in_ESI < in_RDI[2]) {
    local_8 = 0.0;
  }
  else if (in_RDI[3] < in_ESI) {
    local_8 = 0.0;
  }
  else {
    __first = std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::begin
                        (in_stack_ffffffffffffffa8);
    __last = std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::end
                       (in_stack_ffffffffffffffa8);
    pVar2 = std::make_pair<int&,double>(in_RDI,(double *)in_stack_ffffffffffffffa8);
    local_20[0] = std::
                  upper_bound<__gnu_cxx::__normal_iterator<std::pair<int,double>const*,std::vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>>,std::pair<int,double>>
                            (__first._M_current,__last._M_current,(pair<int,_double> *)pVar2.second)
    ;
    __gnu_cxx::
    __normal_iterator<const_std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
    ::operator--(local_20);
    ppVar1 = __gnu_cxx::
             __normal_iterator<const_std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
             ::operator->(local_20);
    local_8 = ppVar1->second;
  }
  return local_8;
}

Assistant:

double HistogramBasedDistribution::probability(int value) const {
	if (value < min) return 0.0;
	if (value > max) return 0.0;
	typedef vector<value_t>::const_iterator iter_t;
	iter_t cit = upper_bound(values.begin(), values.end(), make_pair(value,2.0));
	--cit;
	return cit->second;
}